

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_consumer.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::ParseSimpleStream
          (objectivec *this,ZeroCopyInputStream *input_stream,string_view stream_name,
          LineConsumer *line_consumer,string *out_error)

{
  string_view pc;
  string_view pc_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  AlphaNum local_308;
  AlphaNum local_2d8;
  AlphaNum local_2a8;
  ZeroCopyInputStream *local_278;
  char *pcStack_270;
  AlphaNum local_260;
  AlphaNum local_230;
  string local_200;
  undefined4 local_1dc;
  AlphaNum local_1d8;
  AlphaNum local_1a8;
  AlphaNum local_178;
  ZeroCopyInputStream *local_148;
  char *pcStack_140;
  AlphaNum local_138;
  AlphaNum local_108;
  string local_d8;
  string_view local_b8;
  int local_a4;
  char *pcStack_a0;
  int buf_len;
  void *buf;
  undefined1 local_88 [8];
  Parser parser;
  string local_error;
  string *out_error_local;
  LineConsumer *line_consumer_local;
  ZeroCopyInputStream *input_stream_local;
  string_view stream_name_local;
  
  pcVar4 = (char *)stream_name._M_len;
  std::__cxx11::string::string((string *)(parser.leftover_.field_2._M_local_buf + 8));
  anon_unknown_0::Parser::Parser((Parser *)local_88,(LineConsumer *)stream_name._M_str);
  do {
    do {
      bVar1 = (**(code **)(*(long *)this + 0x10))(this,&stack0xffffffffffffff60,&local_a4);
      if ((bVar1 & 1) == 0) {
        bVar2 = anon_unknown_0::Parser::Finish
                          ((Parser *)local_88,(string *)((long)&parser.leftover_.field_2 + 8));
        if (bVar2) {
          stream_name_local._M_str._7_1_ = true;
        }
        else {
          absl::lts_20250127::AlphaNum::AlphaNum(&local_230,"error: ");
          pc._M_str = pcVar4;
          pc._M_len = (size_t)input_stream;
          local_278 = input_stream;
          pcStack_270 = pcVar4;
          absl::lts_20250127::AlphaNum::AlphaNum(&local_260,pc);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_2a8," Line ");
          iVar3 = anon_unknown_0::Parser::last_line((Parser *)local_88);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_2d8,iVar3);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_308,", ");
          absl::lts_20250127::StrCat<std::__cxx11::string>
                    (&local_200,(lts_20250127 *)&local_230,&local_260,&local_2a8,&local_2d8,
                     &local_308,(AlphaNum *)((long)&parser.leftover_.field_2 + 8),
                     in_stack_fffffffffffffce0);
          std::__cxx11::string::operator=((string *)line_consumer,(string *)&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          stream_name_local._M_str._7_1_ = false;
        }
        goto LAB_01726d59;
      }
    } while (local_a4 == 0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_b8,pcStack_a0,(long)local_a4);
    bVar2 = anon_unknown_0::Parser::ParseChunk
                      ((Parser *)local_88,local_b8,(string *)((long)&parser.leftover_.field_2 + 8));
  } while (bVar2);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_108,"error: ");
  pc_00._M_str = pcVar4;
  pc_00._M_len = (size_t)input_stream;
  local_148 = input_stream;
  pcStack_140 = pcVar4;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_138,pc_00);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_178," Line ");
  iVar3 = anon_unknown_0::Parser::last_line((Parser *)local_88);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1a8,iVar3);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1d8,", ");
  absl::lts_20250127::StrCat<std::__cxx11::string>
            (&local_d8,(lts_20250127 *)&local_108,&local_138,&local_178,&local_1a8,&local_1d8,
             (AlphaNum *)((long)&parser.leftover_.field_2 + 8),in_stack_fffffffffffffce0);
  std::__cxx11::string::operator=((string *)line_consumer,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  stream_name_local._M_str._7_1_ = false;
LAB_01726d59:
  local_1dc = 1;
  anon_unknown_0::Parser::~Parser((Parser *)local_88);
  std::__cxx11::string::~string((string *)(parser.leftover_.field_2._M_local_buf + 8));
  return stream_name_local._M_str._7_1_;
}

Assistant:

bool ParseSimpleStream(io::ZeroCopyInputStream& input_stream,
                       absl::string_view stream_name,
                       LineConsumer* line_consumer, std::string* out_error) {
  std::string local_error;
  Parser parser(line_consumer);
  const void* buf;
  int buf_len;
  while (input_stream.Next(&buf, &buf_len)) {
    if (buf_len == 0) {
      continue;
    }

    if (!parser.ParseChunk(
            absl::string_view(static_cast<const char*>(buf), (size_t)buf_len),
            &local_error)) {
      *out_error = absl::StrCat("error: ", stream_name, " Line ",
                                parser.last_line(), ", ", local_error);
      return false;
    }
  }
  if (!parser.Finish(&local_error)) {
    *out_error = absl::StrCat("error: ", stream_name, " Line ",
                              parser.last_line(), ", ", local_error);
    return false;
  }
  return true;
}